

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O1

void __thiscall QHybrid::Load(QHybrid *this,string *filename)

{
  size_t nrRows;
  QFunctionJointBeliefInterface *pQVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  size_t nrColumns;
  undefined8 *puVar5;
  string buffer;
  stringstream ss;
  istringstream is;
  ifstream fp;
  char *local_580;
  long local_578;
  char local_570;
  undefined7 uStack_56f;
  long local_560;
  long local_558;
  undefined1 local_540 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530 [7];
  ios_base local_4c0 [264];
  long *local_3b8 [2];
  long local_3a8 [13];
  ios_base local_340 [272];
  long local_230 [2];
  ostream local_220 [16];
  byte abStack_210 [96];
  ios_base local_1b0 [392];
  
  if (this->_m_horizonLastTimeSteps == 0) {
    this->_m_optimizedHorLast = true;
    std::__cxx11::stringstream::stringstream((stringstream *)local_540);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_540 + 0x10),(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_horLast",8);
    std::__cxx11::stringbuf::str();
    std::ifstream::ifstream(local_230,(char *)local_3b8[0],_S_in);
    if (local_3b8[0] != local_3a8) {
      operator_delete(local_3b8[0],local_3a8[0] + 1);
    }
    if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3a8,"QHybrid::Load: failed to ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,"open file ",10);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a8,local_580,local_578);
      if (local_580 != &local_570) {
        operator_delete(local_580,CONCAT71(uStack_56f,local_570) + 1);
      }
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar5 = &PTR__E_0059bd80;
      puVar5[1] = puVar5 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar5 + 1),local_560,local_558 + local_560);
      __cxa_throw(puVar5,&E::typeinfo,E::~E);
    }
    local_578 = 0;
    local_570 = '\0';
    local_580 = &local_570;
    cVar2 = std::ios::widen((char)local_230 + (char)*(undefined8 *)(local_230[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_230,(string *)&local_580,cVar2);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_3b8,(string *)&local_580,_S_in);
    std::istream::_M_extract<unsigned_long>((ulong *)local_3b8);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
    std::ios_base::~ios_base(local_340);
    if (local_580 != &local_570) {
      operator_delete(local_580,CONCAT71(uStack_56f,local_570) + 1);
    }
    std::ifstream::~ifstream(local_230);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_540);
    std::ios_base::~ios_base(local_4c0);
  }
  else {
    this->_m_optimizedHorLast = false;
  }
  if (this->_m_initialized == false) {
    Initialize(this);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_230);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_220,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_firstTS",8);
  std::__cxx11::stringbuf::str();
  nrRows = this->_m_nrJAOHinFirstTS;
  lVar4 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
  lVar4 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar4) + 0x60))
                    (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar4);
  nrColumns = (**(code **)(**(long **)(lVar4 + 0x30) + 0x68))();
  QTable::Load((string *)local_540,nrRows,nrColumns,&this->_m_QValuesFirstTimeSteps);
  if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
    operator_delete((void *)local_540._0_8_,local_530[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
  std::ios_base::~ios_base(local_1b0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_230);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_220,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_lastTS",7);
  pQVar1 = this->_m_QlastTimeSteps;
  lVar4 = *(long *)((long)*pQVar1 + -0x60);
  std::__cxx11::stringbuf::str();
  (**(code **)(*(long *)((long)&pQVar1->field_0x0 + lVar4) + 0x28))
            ((long)&pQVar1->field_0x0 + lVar4,local_540);
  if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
    operator_delete((void *)local_540._0_8_,local_530[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
  std::ios_base::~ios_base(local_1b0);
  return;
}

Assistant:

void QHybrid::Load(const std::string& filename)
{
    // figure out what _m_horizonLastTimeSteps should be by reading it from disk
    if(_m_horizonLastTimeSteps==0)
    {
        SetOptimizedHorLast(true);
        stringstream ss;
        ss << filename << "_horLast";
        ifstream fp(ss.str().c_str());
        if(!fp)
        {
            stringstream ss1;
            ss1 << "QHybrid::Load: failed to "
               << "open file " << ss.str();
            throw(E(ss1.str()));
        }
        string buffer;
        getline(fp,buffer);
        istringstream is(buffer);
        is >> _m_horizonLastTimeSteps;
    }
    else
        SetOptimizedHorLast(false);

    if(!_m_initialized)
        Initialize();

    {
        stringstream ss;
        ss << filename << "_firstTS";
        QTable::Load(ss.str(),
                     _m_nrJAOHinFirstTS,
                     GetPU()->GetNrJointActions(),
                     _m_QValuesFirstTimeSteps);
    }
    {
        stringstream ss;
        ss << filename << "_lastTS";
        _m_QlastTimeSteps->Load(ss.str());
    }
}